

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O1

VectorType * LLVMBC::cast<LLVMBC::VectorType>(Type *type)

{
  TypeID TVar1;
  LoggingCallback p_Var2;
  void *pvVar3;
  char buffer [4096];
  char acStack_1018 [4104];
  
  TVar1 = Type::getTypeID(type);
  if (TVar1 == VectorTyID) {
    return (VectorType *)type;
  }
  p_Var2 = ::dxil_spv::get_thread_log_callback();
  if (p_Var2 == (LoggingCallback)0x0) {
    cast<LLVMBC::VectorType>();
    std::terminate();
  }
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var2)(pvVar3,Error,acStack_1018);
  std::terminate();
}

Assistant:

inline T *cast(Type *type)
{
	if (type->getTypeID() != T::get_type_id())
	{
		LOGE("Invalid type ID in cast<T>.\n");
		std::terminate();
	}
	return static_cast<T *>(type);
}